

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicRotorWingAircraft.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::Encode
          (GED_BasicRotorWingAircraft *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GED_BasicRotorWingAircraft *this_local;
  
  GED_BasicFixedWingAircraft::Encode(&this->super_GED_BasicFixedWingAircraft,stream);
  pKVar1 = KDataStream::operator<<(stream,this->m_i8TrrtAz);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8GnElv);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8TrrtSlwRt);
  KDataStream::operator<<(pKVar1,this->m_i8GnElvRt);
  return;
}

Assistant:

void GED_BasicRotorWingAircraft::Encode( KDataStream & stream ) const
{
    GED_BasicFixedWingAircraft::Encode( stream );

    stream << m_i8TrrtAz
           << m_i8GnElv
           << m_i8TrrtSlwRt
           << m_i8GnElvRt;
}